

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

timestamp_t
duckdb::ExtractTimestampUuidOperator::Operation<duckdb::hugeint_t,duckdb::timestamp_t>
          (hugeint_t input,Vector *result)

{
  InvalidInputException *this;
  byte params;
  allocator local_39;
  string local_38;
  
  params = (byte)((uint)input.upper >> 0xc) & 0xf;
  if (params == 7) {
    return (timestamp_t)((input.upper >> 0x10) * 1000);
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Given UUID is with version %u, not version 7.",&local_39);
  InvalidInputException::InvalidInputException<unsigned_char>(this,&local_38,params);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		// Validate whether the given UUID is v7.
		const uint8_t version = (static_cast<uint8_t>((input.upper) >> 8) & 0xf0) >> 4;
		if (version != 7) {
			throw InvalidInputException("Given UUID is with version %u, not version 7.", version);
		}

		// UUID v7 begins with a 48 bit big-endian Unix Epoch timestamp with millisecond granularity.
		const int64_t upper = input.upper;
		int64_t unix_ts_milli = upper;
		unix_ts_milli = unix_ts_milli >> 16;

		static constexpr int64_t kMilliToMicro = 1000;
		const int64_t unix_ts_ms = kMilliToMicro * unix_ts_milli;
		return timestamp_t {unix_ts_ms};
	}